

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pack_dev.c
# Opt level: O2

dev_t pack_8_8(int n,u_long *numbers,char **error)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  
  if (n == 2) {
    uVar1 = numbers[1];
    uVar2 = (uint)*numbers;
    uVar3 = uVar1 & 0xff | (ulong)((uVar2 & 0xff) << 8);
    if (uVar1 < 0x100 && (ulong)(uVar2 & 0xff) == *numbers) {
      return uVar3;
    }
    pcVar4 = "invalid major number";
    if (0xff < uVar1) {
      pcVar4 = "invalid minor number";
    }
  }
  else {
    pcVar4 = "too many fields for format";
    uVar3 = 0;
  }
  *error = pcVar4;
  return uVar3;
}

Assistant:

static dev_t
pack_8_8(int n, u_long numbers[], const char **error)
{
	dev_t dev = 0;

	if (n == 2) {
		dev = makedev_8_8(numbers[0], numbers[1]);
		if ((u_long)major_8_8(dev) != numbers[0])
			*error = iMajorError;
		if ((u_long)minor_8_8(dev) != numbers[1])
			*error = iMinorError;
	} else
		*error = tooManyFields;
	return (dev);
}